

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::ImmediatePromiseNode<unsigned_long>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>(kj *this,unsigned_long *params)

{
  ImmediatePromiseNode<unsigned_long> *this_00;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar1;
  ExceptionOr<unsigned_long> local_188;
  
  this_00 = (ImmediatePromiseNode<unsigned_long> *)operator_new(0x178);
  local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_188.value.ptr.isSet = true;
  local_188.value.ptr.field_1.value = *params;
  _::ImmediatePromiseNode<unsigned_long>::ImmediatePromiseNode(this_00,&local_188);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ImmediatePromiseNode<unsigned_long>>::instance;
  *(ImmediatePromiseNode<unsigned_long> **)(this + 8) = this_00;
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_188);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}